

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O1

filepos_t EBML_ReadCodedSizeSignedValue(uint8_t *InBuffer,size_t *BufferSize,filepos_t *SizeUnknown)

{
  filepos_t fVar1;
  
  fVar1 = EBML_ReadCodedSizeValue(InBuffer,BufferSize,SizeUnknown);
  switch(*BufferSize) {
  case 1:
    fVar1 = fVar1 + -0x3f;
    break;
  case 2:
    fVar1 = fVar1 + -0x1fff;
    break;
  case 3:
    fVar1 = fVar1 + -0xfffff;
    break;
  case 4:
    fVar1 = fVar1 + -0x7ffffff;
  }
  return fVar1;
}

Assistant:

filepos_t EBML_ReadCodedSizeSignedValue(const uint8_t *InBuffer, size_t *BufferSize, filepos_t *SizeUnknown)
{
    filepos_t Result = EBML_ReadCodedSizeValue(InBuffer, BufferSize, SizeUnknown);

    if (*BufferSize != 0)
    {
        switch (*BufferSize)
        {
        case 1:
            Result -= 63;
            break;
        case 2:
            Result -= 8191;
            break;
        case 3:
            Result -= 1048575L;
            break;
        case 4:
            Result -= 134217727L;
            break;
        }
    }

    return Result;
}